

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O1

void uss_stat(SftpServer *srv,SftpReplyBuilder *reply,ptrlen path,_Bool follow_symlinks)

{
  fxp_attrs fVar1;
  int iVar2;
  char *__ptr;
  code *pcVar3;
  SftpReplyBuilder *reply_00;
  undefined7 in_register_00000081;
  stat st;
  SftpReplyBuilder local_a8 [3];
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined8 local_78;
  undefined8 local_60;
  unsigned_long local_50;
  
  __ptr = mkstr(path);
  if ((int)CONCAT71(in_register_00000081,follow_symlinks) == 0) {
    pcVar3 = lstat;
  }
  else {
    pcVar3 = stat;
  }
  reply_00 = local_a8;
  iVar2 = (*pcVar3)(__ptr);
  free(__ptr);
  if (iVar2 < 0) {
    uss_error((UnixSftpServer *)reply,reply_00);
  }
  else {
    fVar1.size = local_78;
    fVar1.flags = 0xf;
    fVar1.uid._0_4_ = local_8c;
    fVar1.uid._4_4_ = 0;
    fVar1.gid._0_4_ = local_88;
    fVar1.gid._4_4_ = 0;
    fVar1.permissions._0_4_ = local_90;
    fVar1.permissions._4_4_ = 0;
    fVar1.atime = local_60;
    fVar1.mtime = local_50;
    (*reply->vt->reply_attrs)(reply,fVar1);
  }
  return;
}

Assistant:

static void uss_stat(SftpServer *srv, SftpReplyBuilder *reply,
                     ptrlen path, bool follow_symlinks)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);
    struct stat st;

    char *pathstr = mkstr(path);
    int status = (follow_symlinks ? stat : lstat) (pathstr, &st);
    free(pathstr);

    if (status < 0) {
        uss_error(uss, reply);
    } else {
        uss_reply_struct_stat(reply, &st);
    }
}